

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O2

slReturn rcvUbxMsg(int fdPort,ubxMsg *msg,int max_ms)

{
  errInfo error;
  _Bool _Var1;
  longlong lVar2;
  longlong lVar3;
  slReturn pvVar4;
  char *msg_00;
  ulong uVar5;
  errorInfo_slReturn local_70;
  errorInfo_slReturn local_50;
  
  *(undefined8 *)msg = 0;
  msg->body = (slBuffer *)0x0;
  *(undefined8 *)&msg->checksum = 0;
  lVar2 = currentTimeMs();
  uVar5 = (ulong)(uint)max_ms;
  do {
    lVar3 = currentTimeMs();
    if ((long)uVar5 <= lVar3 - lVar2) {
      createErrorInfo(&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                      ,"rcvUbxMsg",0xd3,(slReturn)0x0);
      msg_00 = "timed out while waiting to receive UBX message";
      local_50.cause = local_70.cause;
      local_50.fileName = local_70.fileName;
      local_50.functionName = local_70.functionName;
      local_50._24_8_ = local_70._24_8_;
LAB_00109048:
      error.fileName = local_50.fileName;
      error.cause = local_50.cause;
      error.functionName = local_50.functionName;
      error.lineNumber = local_50.lineNumber;
      error._28_4_ = local_50._28_4_;
      pvVar4 = makeErrorMsgReturn(error,msg_00);
      return pvVar4;
    }
    while( true ) {
      lVar3 = currentTimeMs();
      if ((long)uVar5 <= lVar3 - lVar2) break;
      lVar3 = currentTimeMs();
      pvVar4 = readSerialChar(fdPort,(lVar2 + uVar5) - lVar3);
      _Var1 = isErrorReturn(pvVar4);
      if (_Var1) {
        createErrorInfo(&local_50,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                        ,"rcvUbxMsg",0x95,pvVar4);
        msg_00 = "couldn\'t read serial character";
        goto LAB_00109048;
      }
      _Var1 = isWarningReturn(pvVar4);
      if (_Var1) break;
      getReturnInfo(pvVar4);
    }
  } while( true );
}

Assistant:

static slReturn rcvUbxMsg(int fdPort, ubxMsg* msg, int max_ms) {

    ubxMsg nomsg = { {0, 0}, NULL, {0, 0}};
    *msg = nomsg;

    long long startTime = currentTimeMs();

    while (((currentTimeMs() - startTime) < max_ms)) {

        // first we synchronize on the 0xB5, 0x62 byte pair that starts every UBX message...
        int count = 0;
        while (((currentTimeMs() - startTime) < max_ms) && (count < 2)) {
            slReturn rscResp = readSerialChar(fdPort, startTime + max_ms - currentTimeMs());

            if (isErrorReturn(rscResp))
                return makeErrorMsgReturn(ERR_CAUSE(rscResp), "couldn't read serial character");

            if (isWarningReturn(rscResp))
                break;  // if we timed out...

            int c= getReturnInfoChar(rscResp);
            if (c >= 0) {
                if ((count == 0) && (c == UBX_SYNC1)) {
                    count++;
                    continue;
                }
                if ((count == 1) && (c == UBX_SYNC2)) {
                    count++;
                    continue;
                }
                count = 0;
            }
        }
        if (count < 2) continue;

        // we're synchronized, so it's time to get the message type...
        byte buff[2];
        slReturn rubResp = readUbxBytes(fdPort, buff, &count, 2, max_ms, startTime, startTime + max_ms - currentTimeMs());
        if (isErrorReturn(rubResp))
            return makeErrorMsgReturn(ERR_CAUSE(rubResp), "couldn't read serial characters while receiving UBX message type");
        if (count < 2) continue;
        ubxType type = {buff[0], buff[1]};
        msg->type = type;

        // get the body length, little-endian...
        rubResp = readUbxBytes(fdPort, buff, &count, 2, max_ms, startTime, startTime + max_ms - currentTimeMs());
        if (isErrorReturn(rubResp))
            return makeErrorMsgReturn(ERR_CAUSE(rubResp), "couldn't read serial characters while receiving UBX message body length");
        if (count < 2) continue;
        size_t length = buff[0] | (buff[1] << 8);

        // now get the body...
        msg->body = create_slBuffer(length, LittleEndian);
        rubResp = readUbxBytes(fdPort, buffer_slBuffer(msg->body), &count, length, max_ms, startTime, startTime + max_ms - currentTimeMs());
        if (isErrorReturn(rubResp))
            return makeErrorFmtMsgReturn(ERR_CAUSE(rubResp),
                                          "couldn't read serial characters while receiving UBX message body (0x%02x/0x%02x, %d bytes)",
                                          type.class, type.id, length);
        msg->checksum = calcFletcherChecksum(*msg);  // this calculates what the checksum SHOULD be...
        if (count >= length) {

            // finally, get the checksum...
            rubResp = readUbxBytes(fdPort, buff, &count, 2, max_ms, startTime, startTime + max_ms - currentTimeMs());
            if (isErrorReturn(rubResp))
                return makeErrorMsgReturn(ERR_CAUSE(rubResp), "couldn't read serial characters while receiving UBX message checksum");
            if (count >= 2) {
                if ((buff[0] == msg->checksum.ck_a) && (buff[1] == msg->checksum.ck_b))
                    return makeOkReturn();
                else {
                    free(msg->body);
                    return makeErrorMsgReturn(ERR_ROOT, "UBX received message with checksum error");
                }
            }
        }
        free(msg->body);
    }

    return makeErrorMsgReturn(ERR_ROOT, "timed out while waiting to receive UBX message");
}